

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::reorderPatternsByPartition
          (BeagleCPUImpl<float,_1,_0> *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  double *__ptr;
  int **ppiVar5;
  float **ppfVar6;
  int i_2;
  int *piVar7;
  void *__ptr_00;
  double *pdVar8;
  float *__ptr_01;
  int *piVar9;
  int i;
  int iVar10;
  long lVar11;
  int j;
  long lVar12;
  int i_3;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  float *pfVar17;
  
  if (this->kPatternsReordered != false) {
    return -7;
  }
  iVar14 = this->kPatternCount;
  piVar7 = (int *)malloc((long)iVar14 * 4);
  this->gPatternsNewOrder = piVar7;
  uVar16 = (ulong)this->kPartitionCount;
  __ptr_00 = malloc(uVar16 << 2);
  pdVar8 = (double *)malloc((long)iVar14 << 3);
  piVar9 = this->gPatternPartitionsStartPatterns;
  for (lVar11 = 0; lVar11 < (int)uVar16; lVar11 = lVar11 + 1) {
    piVar9[lVar11] = 0;
    *(undefined4 *)((long)__ptr_00 + lVar11 * 4) = 0;
    uVar16 = (ulong)(uint)this->kPartitionCount;
  }
  uVar1 = this->kPatternCount;
  piVar4 = this->gPatternPartitions;
  for (uVar13 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar13; uVar13 = uVar13 + 1) {
    iVar14 = piVar4[uVar13];
    iVar10 = *(int *)((long)__ptr_00 + (long)iVar14 * 4);
    piVar7[uVar13] = iVar10;
    *(int *)((long)__ptr_00 + (long)iVar14 * 4) = iVar10 + 1;
  }
  for (lVar11 = 0; lVar11 < (int)uVar16; lVar11 = lVar11 + 1) {
    piVar9 = this->gPatternPartitionsStartPatterns;
    for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 1) {
      piVar9[lVar11] = piVar9[lVar11] + *(int *)((long)__ptr_00 + lVar12 * 4);
    }
    uVar16 = (ulong)(uint)this->kPartitionCount;
  }
  uVar1 = this->kPatternCount;
  piVar9[(int)uVar16] = uVar1;
  __ptr = this->gPatternWeights;
  piVar4 = this->gPatternPartitions;
  for (uVar16 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar16; uVar16 = uVar16 + 1) {
    iVar14 = piVar7[uVar16];
    iVar10 = piVar9[piVar4[uVar16]];
    piVar7[uVar16] = (int)((long)iVar14 + (long)iVar10);
    pdVar8[(long)iVar14 + (long)iVar10] = __ptr[uVar16];
  }
  iVar14 = 0;
  for (lVar11 = 0; lVar11 < this->kPartitionCount; lVar11 = lVar11 + 1) {
    uVar1 = *(uint *)((long)__ptr_00 + lVar11 * 4);
    piVar9 = this->gPatternPartitions;
    iVar10 = (~((int)uVar1 >> 0x1f) & uVar1) + iVar14;
    for (lVar12 = (long)iVar14; iVar10 != lVar12; lVar12 = lVar12 + 1) {
      piVar9[lVar12] = (int)lVar11;
    }
    iVar14 = iVar10;
  }
  free(__ptr_00);
  free(__ptr);
  this->gPatternWeights = pdVar8;
  __ptr_01 = (float *)mallocAligned(this,(long)this->kPartialsSize << 2);
  piVar9 = (int *)mallocAligned(this,(long)this->kPaddedPatternCount << 2);
  for (lVar11 = 0; lVar11 < this->kTipCount; lVar11 = lVar11 + 1) {
    ppiVar5 = this->gTipStates;
    piVar7 = ppiVar5[lVar11];
    if (piVar7 == (int *)0x0) {
      ppfVar6 = this->gPartials;
      uVar1 = this->kPatternCount;
      uVar2 = this->kCategoryCount;
      iVar14 = 0;
      pfVar17 = ppfVar6[lVar11];
      for (uVar15 = 0; uVar15 != (~((int)uVar2 >> 0x1f) & uVar2); uVar15 = uVar15 + 1) {
        uVar3 = this->kStateCount;
        iVar10 = uVar3 * iVar14;
        for (uVar16 = 0; uVar16 != (~((int)uVar1 >> 0x1f) & uVar1); uVar16 = uVar16 + 1) {
          piVar7 = this->gPatternsNewOrder;
          for (uVar13 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar13; uVar13 = uVar13 + 1) {
            __ptr_01[(int)((piVar7[uVar16] + iVar14) * uVar3 + (int)uVar13)] =
                 pfVar17[iVar10 + (int)uVar13];
          }
          iVar10 = iVar10 + uVar3;
        }
        iVar14 = iVar14 + uVar1;
      }
      ppfVar6[lVar11] = __ptr_01;
    }
    else {
      piVar4 = this->gPatternsNewOrder;
      for (lVar12 = 0; lVar12 < this->kPatternCount; lVar12 = lVar12 + 1) {
        piVar9[piVar4[lVar12]] = piVar7[lVar12];
      }
      ppiVar5[lVar11] = piVar9;
      piVar9 = piVar7;
      pfVar17 = __ptr_01;
    }
    __ptr_01 = pfVar17;
  }
  free(__ptr_01);
  free(piVar9);
  this->kPatternsReordered = true;
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::reorderPatternsByPartition() {

    if (!kPatternsReordered) {
        gPatternsNewOrder = (int*) malloc(kPatternCount * sizeof(int));
    } else {
        return BEAGLE_ERROR_NO_IMPLEMENTATION;
    }

    int* partitionSizes = (int*) malloc(kPartitionCount * sizeof(int));
    double* sortedPatternWeights = (double*) malloc(sizeof(double) * kPatternCount);

    for (int i=0; i < kPartitionCount; i++) {
        gPatternPartitionsStartPatterns[i] = 0;
        partitionSizes[i] = 0;
    }

    for (int i=0; i < kPatternCount; i++) {
         gPatternsNewOrder[i] = partitionSizes[gPatternPartitions[i]]++;
    }

    for (int i=0; i < kPartitionCount; i++) {
        for (int j=0; j < i; j++) {
            gPatternPartitionsStartPatterns[i] += partitionSizes[j];
        }
    }
    gPatternPartitionsStartPatterns[kPartitionCount] = kPatternCount;

    for (int i=0; i < kPatternCount; i++) {
        gPatternsNewOrder[i] += gPatternPartitionsStartPatterns[gPatternPartitions[i]];
        sortedPatternWeights[gPatternsNewOrder[i]] = gPatternWeights[i];
    }


    int currentPattern = 0;
    for (int i=0; i < kPartitionCount; i++) {
        for (int j=0; j < partitionSizes[i]; j++) {
            gPatternPartitions[currentPattern++] = i;
        }
    }

    free(partitionSizes);
    free(gPatternWeights);
    gPatternWeights = sortedPatternWeights;

    REALTYPE* sortedPartials = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
    int* sortedTips = (int*) mallocAligned(sizeof(int) * kPaddedPatternCount);

    for (int tip=0; tip < kTipCount; tip++) {
        if (gTipStates[tip] == NULL) {
            REALTYPE* unsortedPartials = gPartials[tip];
            for (int l=0; l < kCategoryCount; l++) {
                for (int i=0; i < kPatternCount; i++) {
                    for (int j=0; j < kStateCount; j++) {
                        int sortIndex = l*kStateCount*kPatternCount + gPatternsNewOrder[i]*kStateCount + j;
                        int pIndex = l*kStateCount*kPatternCount + i*kStateCount + j;
                        sortedPartials[sortIndex] = unsortedPartials[pIndex];
                    }
                }
            }
            gPartials[tip] = sortedPartials;
            sortedPartials = unsortedPartials;
        } else {
            int* unsortedTips = gTipStates[tip];
            for (int i=0; i < kPatternCount; i++) {
                int sortIndex = gPatternsNewOrder[i];
                int pIndex = i;
                sortedTips[sortIndex] = unsortedTips[pIndex];
            }
            gTipStates[tip] = sortedTips;
            sortedTips = unsortedTips;
        }
    }

    free(sortedPartials);
    free(sortedTips);

    kPatternsReordered = true;

    return BEAGLE_SUCCESS;
}